

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O1

int stscanf(tchar_t *In,tchar_t *Mask,...)

{
  byte bVar1;
  double dVar2;
  double dVar3;
  char in_AL;
  int iVar4;
  size_t sVar5;
  int iVar6;
  undefined8 in_RCX;
  long lVar7;
  undefined8 in_RDX;
  long lVar8;
  int iVar9;
  uint uVar10;
  undefined8 in_R8;
  byte *pbVar11;
  uint uVar12;
  undefined8 in_R9;
  ulong uVar13;
  void **ppvVar14;
  long lVar15;
  uint uVar16;
  size_t sVar17;
  byte *pbVar18;
  int iVar19;
  bool bVar20;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list Arg;
  void **local_f0;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined4 local_88;
  undefined4 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Da;
    local_78 = in_XMM3_Da;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  sVar5 = strlen(In);
  local_f0 = &Arg[0].overflow_arg_area;
  uVar16 = 0x10;
  if (In == (tchar_t *)0x0 || sVar5 == 0) {
    return 0;
  }
  lVar8 = 0;
  iVar4 = 0;
  do {
    bVar1 = *Mask;
    if (bVar1 < 0x20) {
      if (bVar1 == 9) goto LAB_0011f28b;
      if (bVar1 == 0) {
        return iVar4;
      }
LAB_0011f2b7:
      if (bVar1 == *In) {
        In = (tchar_t *)((byte *)In + 1);
        sVar5 = sVar5 - 1;
      }
      else {
LAB_0011f68b:
        In = (tchar_t *)(byte *)0x0;
      }
    }
    else if (bVar1 == 0x20) {
LAB_0011f28b:
      pbVar18 = (byte *)In + sVar5;
      do {
        if ((0x20 < (ulong)(byte)*In) || ((0x100002600U >> ((ulong)(byte)*In & 0x3f) & 1) == 0))
        goto LAB_0011f778;
        In = (tchar_t *)((byte *)In + 1);
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
      sVar5 = 0;
      In = (tchar_t *)pbVar18;
    }
    else {
      if (bVar1 != 0x25) goto LAB_0011f2b7;
      pbVar18 = (byte *)Mask + 1;
      Mask = (tchar_t *)((byte *)Mask + 1);
      uVar12 = 0xffffffff;
      if (0xfffffff5 < (int)(char)*pbVar18 - 0x3aU) {
        uVar10 = (int)(char)*pbVar18 - 0x30;
        uVar12 = 0;
        if (uVar10 < 10) {
          uVar12 = 0;
          do {
            uVar12 = uVar10 + uVar12 * 10;
            pbVar18 = (byte *)Mask + 1;
            Mask = (tchar_t *)((byte *)Mask + 1);
            uVar10 = (int)(char)*pbVar18 - 0x30;
          } while (uVar10 < 10);
        }
      }
      for (; bVar1 = *Mask, bVar1 == 0x6c; Mask = (tchar_t *)((byte *)Mask + 1)) {
        lVar8 = lVar8 + 1;
      }
      if (bVar1 < 0x69) {
        if (bVar1 == 0x58) {
LAB_0011f2e8:
          pbVar18 = (byte *)In + sVar5;
          do {
            if ((0x20 < (ulong)(byte)*In) || ((0x100002600U >> ((ulong)(byte)*In & 0x3f) & 1) == 0))
            goto LAB_0011f309;
            In = (tchar_t *)((byte *)In + 1);
            sVar5 = sVar5 - 1;
          } while (sVar5 != 0);
          sVar5 = 0;
          In = (tchar_t *)pbVar18;
LAB_0011f309:
          bVar1 = *In;
          uVar13 = (ulong)(bVar1 == 0x2d);
          pbVar18 = (byte *)In + uVar13;
          sVar5 = sVar5 - uVar13;
          if ((sVar5 == 0) || (uVar10 = (uint)(bVar1 == 0x2d), uVar12 == uVar10)) {
            iVar19 = 0;
          }
          else {
            iVar9 = uVar12 - uVar10;
            sVar17 = sVar5;
            iVar19 = 0;
            while( true ) {
              iVar9 = iVar9 + -1;
              iVar6 = (int)(char)*pbVar18;
              sVar5 = sVar17;
              if (*pbVar18 == 0) break;
              uVar12 = iVar6 - 0x30;
              if (9 < uVar12) {
                if (iVar6 - 0x61U < 6) {
                  uVar12 = iVar6 - 0x57;
                }
                else {
                  uVar12 = iVar6 - 0x37;
                  if (5 < iVar6 - 0x41U) {
                    uVar12 = 0xffffffff;
                  }
                }
              }
              iVar6 = uVar12 + iVar19 * 0x10;
              if ((int)uVar12 < 0) break;
              pbVar18 = pbVar18 + 1;
              sVar5 = sVar17 - 1;
              iVar19 = iVar6;
              if ((sVar17 == 1) || (sVar17 = sVar5, iVar9 == 0)) break;
            }
          }
          if (pbVar18 == (byte *)In) goto LAB_0011f68b;
          iVar9 = -iVar19;
          if (bVar1 != 0x2d) {
            iVar9 = iVar19;
          }
          uVar13 = (ulong)uVar16;
          if (uVar13 < 0x29) {
            uVar16 = uVar16 + 8;
            ppvVar14 = (void **)((long)local_d8 + uVar13);
          }
          else {
            ppvVar14 = local_f0;
            local_f0 = local_f0 + 1;
          }
          *(int *)*ppvVar14 = iVar9;
        }
        else {
          if (bVar1 == 100) goto LAB_0011f3b4;
          if (bVar1 != 0x66) goto LAB_0011f778;
          pbVar18 = (byte *)In + sVar5;
          do {
            if ((0x20 < (ulong)(byte)*In) || ((0x100002600U >> ((ulong)(byte)*In & 0x3f) & 1) == 0))
            goto LAB_0011f247;
            In = (tchar_t *)((byte *)In + 1);
            sVar5 = sVar5 - 1;
          } while (sVar5 != 0);
          sVar5 = 0;
          In = (tchar_t *)pbVar18;
LAB_0011f247:
          uVar13 = (ulong)(*In == 0x2d);
          pbVar11 = (byte *)In + uVar13;
          sVar5 = sVar5 - uVar13;
          bVar20 = sVar5 == 0;
          if (bVar20) {
            lVar7 = 0;
          }
          else {
            iVar19 = (int)(char)((byte *)In)[uVar13];
            if (iVar19 - 0x3aU < 0xfffffff6) {
              lVar7 = 0;
              bVar20 = false;
            }
            else {
              lVar15 = uVar13 + sVar5;
              lVar7 = 0;
              do {
                lVar7 = (long)(char)iVar19 + lVar7 * 10 + -0x30;
                bVar20 = sVar5 == 1;
                if (bVar20) {
                  sVar5 = 0;
                  pbVar11 = (byte *)In + lVar15;
                  break;
                }
                iVar19 = (int)(char)pbVar11[1];
                pbVar11 = pbVar11 + 1;
                sVar5 = sVar5 - 1;
              } while (0xfffffff5 < iVar19 - 0x3aU);
            }
          }
          lVar15 = -lVar7;
          if (*In != 0x2d) {
            lVar15 = lVar7;
          }
          if (pbVar11 == (byte *)In) goto LAB_0011f68b;
          dVar2 = 0.0;
          pbVar18 = pbVar11;
          if (bVar20) {
            sVar5 = 0;
LAB_0011f6e7:
            dVar3 = 1.0;
          }
          else {
            if (*pbVar11 != 0x2e) goto LAB_0011f6e7;
            pbVar18 = pbVar11 + 1;
            if (sVar5 - 1 == 0) {
              sVar5 = 0;
              goto LAB_0011f6e7;
            }
            pbVar11 = pbVar11 + sVar5;
            dVar3 = 1.0;
            lVar7 = 0;
            sVar5 = sVar5 - 1;
            do {
              if ((int)(char)*pbVar18 - 0x3aU < 0xfffffff6) goto LAB_0011f791;
              lVar7 = (long)(int)(char)*pbVar18 + lVar7 * 10 + -0x30;
              dVar3 = dVar3 / 10.0;
              pbVar18 = pbVar18 + 1;
              sVar5 = sVar5 - 1;
            } while (sVar5 != 0);
            sVar5 = 0;
            pbVar18 = pbVar11;
LAB_0011f791:
            dVar2 = (double)lVar7;
          }
          if (lVar8 == 0) {
            uVar13 = (ulong)uVar16;
            if (uVar13 < 0x29) {
              uVar16 = uVar16 + 8;
              ppvVar14 = (void **)((long)local_d8 + uVar13);
            }
            else {
              ppvVar14 = local_f0;
              local_f0 = local_f0 + 1;
            }
            *(float *)*ppvVar14 = (float)(dVar2 * dVar3) + (float)lVar15;
          }
          else {
            uVar13 = (ulong)uVar16;
            if (uVar13 < 0x29) {
              uVar16 = uVar16 + 8;
              ppvVar14 = (void **)((long)local_d8 + uVar13);
            }
            else {
              ppvVar14 = local_f0;
              local_f0 = local_f0 + 1;
            }
            *(double *)*ppvVar14 = dVar2 * dVar3 + (double)lVar15;
          }
        }
      }
      else if (bVar1 == 0x69) {
LAB_0011f3b4:
        pbVar18 = (byte *)In + sVar5;
        do {
          if ((0x20 < (ulong)(byte)*In) || ((0x100002600U >> ((ulong)(byte)*In & 0x3f) & 1) == 0))
          goto LAB_0011f3d5;
          In = (tchar_t *)((byte *)In + 1);
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
        sVar5 = 0;
        In = (tchar_t *)pbVar18;
LAB_0011f3d5:
        uVar13 = (ulong)(*In == 0x2d);
        pbVar18 = (byte *)In + uVar13;
        sVar5 = sVar5 - uVar13;
        if ((sVar5 == 0) || (uVar12 == 0)) {
          lVar7 = 0;
        }
        else {
          lVar7 = 0;
          sVar17 = sVar5;
          while( true ) {
            uVar12 = uVar12 - 1;
            sVar5 = sVar17;
            if ((int)(char)*pbVar18 - 0x3aU < 0xfffffff6) break;
            lVar7 = (long)(int)(char)*pbVar18 + lVar7 * 10 + -0x30;
            pbVar18 = pbVar18 + 1;
            sVar5 = sVar17 - 1;
            if ((sVar17 == 1) || (sVar17 = sVar5, uVar12 == 0)) break;
          }
        }
        lVar15 = -lVar7;
        if (*In != 0x2d) {
          lVar15 = lVar7;
        }
        if (pbVar18 == (byte *)In) goto LAB_0011f68b;
        if (lVar8 == 0) {
          uVar13 = (ulong)uVar16;
          if (uVar13 < 0x29) {
            uVar16 = uVar16 + 8;
            ppvVar14 = (void **)((long)local_d8 + uVar13);
          }
          else {
            ppvVar14 = local_f0;
            local_f0 = local_f0 + 1;
          }
          *(int *)*ppvVar14 = (int)lVar15;
        }
        else {
          uVar13 = (ulong)uVar16;
          if (uVar13 < 0x29) {
            uVar16 = uVar16 + 8;
            ppvVar14 = (void **)((long)local_d8 + uVar13);
          }
          else {
            ppvVar14 = local_f0;
            local_f0 = local_f0 + 1;
          }
          *(long *)*ppvVar14 = lVar15;
        }
      }
      else {
        if (bVar1 != 0x6f) {
          if (bVar1 != 0x78) goto LAB_0011f778;
          goto LAB_0011f2e8;
        }
        pbVar18 = (byte *)In + sVar5;
        do {
          if ((0x20 < (ulong)(byte)*In) || ((0x100002600U >> ((ulong)(byte)*In & 0x3f) & 1) == 0))
          goto LAB_0011f476;
          In = (tchar_t *)((byte *)In + 1);
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
        sVar5 = 0;
        In = (tchar_t *)pbVar18;
LAB_0011f476:
        uVar13 = (ulong)(*In == 0x2d);
        pbVar18 = (byte *)In + uVar13;
        sVar5 = sVar5 - uVar13;
        if ((sVar5 == 0) || (uVar12 == 0)) {
          iVar19 = 0;
        }
        else {
          iVar19 = 0;
          sVar17 = sVar5;
          while( true ) {
            uVar12 = uVar12 - 1;
            sVar5 = sVar17;
            if ((*pbVar18 & 0xf8) != 0x30) break;
            iVar19 = (uint)(byte)(*pbVar18 - 0x30) + iVar19 * 8;
            pbVar18 = pbVar18 + 1;
            sVar5 = sVar17 - 1;
            if ((sVar17 == 1) || (sVar17 = sVar5, uVar12 == 0)) break;
          }
        }
        if (pbVar18 == (byte *)In) goto LAB_0011f68b;
        iVar9 = -iVar19;
        if (*In != 0x2d) {
          iVar9 = iVar19;
        }
        uVar13 = (ulong)uVar16;
        if (uVar13 < 0x29) {
          uVar16 = uVar16 + 8;
          ppvVar14 = (void **)((long)local_d8 + uVar13);
        }
        else {
          ppvVar14 = local_f0;
          local_f0 = local_f0 + 1;
        }
        *(int *)*ppvVar14 = iVar9;
      }
      iVar4 = iVar4 + 1;
      In = (tchar_t *)pbVar18;
    }
LAB_0011f778:
    if (sVar5 == 0) {
      return iVar4;
    }
    Mask = (tchar_t *)((byte *)Mask + 1);
    if ((byte *)In == (byte *)0x0) {
      return iVar4;
    }
  } while( true );
}

Assistant:

int stscanf(const tchar_t* In, const tchar_t* Mask, ...)
{
    int n;
    size_t InLen = tcslen(In);
	va_list Arg;
	va_start(Arg, Mask);
    n = var_stscanf_s(In,&InLen,Mask,Arg);
	va_end(Arg);
    return n;
}